

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

string * __thiscall
bloaty::NameMunger::Munge_abi_cxx11_
          (string *__return_storage_ptr__,NameMunger *this,string_view name)

{
  pointer ppVar1;
  _Head_base<0UL,_bloaty::ReImpl_*,_false> re;
  bool bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *psVar4;
  pointer ppVar5;
  string ret;
  allocator<char> local_c1;
  string local_c0;
  pointer local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  string local_80;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = name._M_str;
  local_40._M_len = name._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_a0,&local_40,(allocator<char> *)&local_c0);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_c0,&local_40,&local_c1);
  ppVar5 = (this->regexes_).
           super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->regexes_).
           super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar5 == ppVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      paVar3 = &local_90;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0 == paVar3) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_90._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_90._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_a0;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_90._M_allocated_capacity;
      }
      psVar4 = &local_98;
      goto LAB_00169c22;
    }
    std::__cxx11::string::string((string *)&local_60,(string *)&local_a0);
    re._M_head_impl =
         (ppVar5->first)._M_t.
         super___uniq_ptr_impl<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>._M_t.
         super__Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>.
         super__Head_base<0UL,_bloaty::ReImpl_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_80,(string *)&ppVar5->second);
    bVar2 = ReImpl::Extract(&local_60,re._M_head_impl,&local_80,&local_c0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    ppVar5 = ppVar5 + 1;
  } while (!bVar2);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar3 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == paVar3) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_c0.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_c0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_c0._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_c0.field_2._M_allocated_capacity
    ;
  }
  psVar4 = &local_c0._M_string_length;
LAB_00169c22:
  __return_storage_ptr__->_M_string_length = *psVar4;
  (((string *)(psVar4 + -1))->_M_dataplus)._M_p = (pointer)paVar3;
  *psVar4 = 0;
  paVar3->_M_local_buf[0] = '\0';
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string NameMunger::Munge(string_view name) const {
  std::string name_str(name);
  std::string ret(name);

  for (const auto& pair : regexes_) {
    if (ReImpl::Extract(name_str, *pair.first, pair.second, &ret)) {
      return ret;
    }
  }

  return name_str;
}